

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O1

void itrans_dct2_h8_w16_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  s16 tmp [128];
  s16 local_140 [16];
  undefined1 auStack_120 [32];
  undefined1 auStack_100 [32];
  undefined1 auStack_e0 [216];
  
  lVar9 = 0;
  auVar17._8_4_ = 0xffe70009;
  auVar17._0_8_ = 0xffe70009ffe70009;
  auVar17._12_4_ = 0xffe70009;
  auVar17._16_4_ = 0xffe70009;
  auVar17._20_4_ = 0xffe70009;
  auVar17._24_4_ = 0xffe70009;
  auVar17._28_4_ = 0xffe70009;
  auVar18._8_4_ = 0xffd40026;
  auVar18._0_8_ = 0xffd40026ffd40026;
  auVar18._12_4_ = 0xffd40026;
  auVar18._16_4_ = 0xffd40026;
  auVar18._20_4_ = 0xffd40026;
  auVar18._24_4_ = 0xffd40026;
  auVar18._28_4_ = 0xffd40026;
  auVar19._8_2_ = 0x20;
  auVar19._0_8_ = 0x20002000200020;
  auVar19._10_2_ = 0x20;
  auVar19._12_2_ = 0x20;
  auVar19._14_2_ = 0x20;
  auVar19._16_2_ = 0x20;
  auVar19._18_2_ = 0x20;
  auVar19._20_2_ = 0x20;
  auVar19._22_2_ = 0x20;
  auVar19._24_2_ = 0x20;
  auVar19._26_2_ = 0x20;
  auVar19._28_2_ = 0x20;
  auVar19._30_2_ = 0x20;
  auVar20._8_4_ = 0xffe00020;
  auVar20._0_8_ = 0xffe00020ffe00020;
  auVar20._12_4_ = 0xffe00020;
  auVar20._16_4_ = 0xffe00020;
  auVar20._20_4_ = 0xffe00020;
  auVar20._24_4_ = 0xffe00020;
  auVar20._28_4_ = 0xffe00020;
  auVar21._8_4_ = 0x11002a;
  auVar21._0_8_ = 0x11002a0011002a;
  auVar21._12_4_ = 0x11002a;
  auVar21._16_4_ = 0x11002a;
  auVar21._20_4_ = 0x11002a;
  auVar21._24_4_ = 0x11002a;
  auVar21._28_4_ = 0x11002a;
  auVar22._8_4_ = 0xffd60011;
  auVar22._0_8_ = 0xffd60011ffd60011;
  auVar22._12_4_ = 0xffd60011;
  auVar22._16_4_ = 0xffd60011;
  auVar22._20_4_ = 0xffd60011;
  auVar22._24_4_ = 0xffd60011;
  auVar22._28_4_ = 0xffd60011;
  auVar23._8_4_ = 0x10;
  auVar23._0_8_ = 0x1000000010;
  auVar23._12_4_ = 0x10;
  auVar23._16_4_ = 0x10;
  auVar23._20_4_ = 0x10;
  auVar23._24_4_ = 0x10;
  auVar23._28_4_ = 0x10;
  do {
    auVar1 = *(undefined1 (*) [16])((long)src + lVar9 + 0x20);
    auVar2 = *(undefined1 (*) [16])((long)src + lVar9 + 0x40);
    auVar3 = *(undefined1 (*) [16])((long)src + lVar9 + 0x60);
    auVar4 = *(undefined1 (*) [16])((long)src + lVar9 + 0xa0);
    auVar5 = *(undefined1 (*) [16])((long)src + lVar9 + 0xe0);
    auVar6 = vpunpcklwd_avx(auVar1,auVar3);
    auVar1 = vpunpckhwd_avx(auVar1,auVar3);
    auVar7 = vpunpcklwd_avx(auVar4,auVar5);
    auVar3 = vpunpckhwd_avx(auVar4,auVar5);
    auVar13._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar6;
    auVar13._16_16_ = ZEXT116(1) * auVar1;
    auVar25 = vpmaddwd_avx2(auVar13,_DAT_0017f620);
    auVar24._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar7;
    auVar24._16_16_ = ZEXT116(1) * auVar3;
    auVar11 = vpmaddwd_avx2(auVar24,_DAT_0017f640);
    auVar25 = vpaddd_avx2(auVar11,auVar25);
    auVar11 = vpmaddwd_avx2(auVar13,_DAT_0017f660);
    auVar15 = vpmaddwd_avx2(auVar24,_DAT_0017f680);
    auVar11 = vpaddd_avx2(auVar15,auVar11);
    auVar15 = vpmaddwd_avx2(auVar13,_DAT_0017f6a0);
    auVar12 = vpmaddwd_avx2(auVar24,_DAT_0017f6c0);
    auVar15 = vpaddd_avx2(auVar12,auVar15);
    auVar12 = vpmaddwd_avx2(auVar13,auVar17);
    auVar24 = vpmaddwd_avx2(auVar24,auVar18);
    auVar12 = vpaddd_avx2(auVar24,auVar12);
    auVar1 = *(undefined1 (*) [16])((long)src + lVar9 + 0x80);
    auVar3 = *(undefined1 (*) [16])((long)src + lVar9 + 0xc0);
    auVar4 = vpunpcklwd_avx(*(undefined1 (*) [16])((long)src + lVar9),auVar1);
    auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])((long)src + lVar9),auVar1);
    auVar5 = vpunpcklwd_avx(auVar2,auVar3);
    auVar2 = vpunpckhwd_avx(auVar2,auVar3);
    auVar14._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar4;
    auVar14._16_16_ = ZEXT116(1) * auVar1;
    auVar24 = vpmaddwd_avx2(auVar19,auVar14);
    auVar14 = vpmaddwd_avx2(auVar20,auVar14);
    auVar10._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar5;
    auVar10._16_16_ = ZEXT116(1) * auVar2;
    auVar13 = vpmaddwd_avx2(auVar21,auVar10);
    auVar10 = vpmaddwd_avx2(auVar22,auVar10);
    auVar16 = vpsubd_avx2(auVar24,auVar13);
    auVar24 = vpaddd_avx2(auVar23,auVar24);
    auVar24 = vpaddd_avx2(auVar24,auVar13);
    auVar8 = vpsubd_avx2(auVar14,auVar10);
    auVar13 = vpaddd_avx2(auVar16,auVar23);
    auVar14 = vpaddd_avx2(auVar14,auVar10);
    auVar14 = vpaddd_avx2(auVar23,auVar14);
    auVar10 = vpaddd_avx2(auVar23,auVar8);
    auVar16 = vpaddd_avx2(auVar25,auVar24);
    auVar8 = vpsubd_avx2(auVar24,auVar25);
    auVar24 = vpaddd_avx2(auVar11,auVar14);
    auVar11 = vpsubd_avx2(auVar14,auVar11);
    auVar25 = vpaddd_avx2(auVar10,auVar15);
    auVar14 = vpsubd_avx2(auVar10,auVar15);
    auVar15 = vpaddd_avx2(auVar13,auVar12);
    auVar12 = vpsubd_avx2(auVar13,auVar12);
    auVar11 = vpsrad_avx2(auVar11,5);
    auVar25 = vpsrad_avx2(auVar25,5);
    auVar25 = vpackssdw_avx2(auVar25,auVar11);
    auVar24 = vpsrad_avx2(auVar24,5);
    auVar11 = vpsrad_avx2(auVar14,5);
    auVar11 = vpackssdw_avx2(auVar24,auVar11);
    auVar24 = vpsrad_avx2(auVar8,5);
    auVar15 = vpsrad_avx2(auVar15,5);
    auVar15 = vpackssdw_avx2(auVar15,auVar24);
    auVar24 = vpsrad_avx2(auVar16,5);
    auVar12 = vpsrad_avx2(auVar12,5);
    auVar12 = vpackssdw_avx2(auVar24,auVar12);
    auVar24 = vpunpcklwd_avx2(auVar12,auVar25);
    auVar25 = vpunpckhwd_avx2(auVar12,auVar25);
    auVar12 = vpunpcklwd_avx2(auVar11,auVar15);
    auVar11 = vpunpckhwd_avx2(auVar11,auVar15);
    auVar13 = vpunpcklwd_avx2(auVar24,auVar12);
    auVar15 = vpunpckhwd_avx2(auVar24,auVar12);
    auVar12 = vpunpcklwd_avx2(auVar25,auVar11);
    auVar25 = vpunpckhwd_avx2(auVar25,auVar11);
    auVar24 = vpunpcklqdq_avx2(auVar13,auVar12);
    auVar11 = vpunpckhqdq_avx2(auVar13,auVar12);
    auVar12 = vpunpcklqdq_avx2(auVar15,auVar25);
    auVar25 = vpunpckhqdq_avx2(auVar15,auVar25);
    auVar15._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar24._0_16_;
    auVar15._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar11._0_16_;
    auVar11 = vperm2i128_avx2(auVar24,auVar11,0x31);
    auVar16._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar12._0_16_;
    auVar16._16_16_ = ZEXT116(0) * auVar12._16_16_ + ZEXT116(1) * auVar25._0_16_;
    auVar25 = vperm2i128_avx2(auVar12,auVar25,0x31);
    *(undefined1 (*) [32])(local_140 + lVar9 * 4) = auVar15;
    *(undefined1 (*) [32])(auStack_120 + lVar9 * 8) = auVar16;
    *(undefined1 (*) [32])(auStack_100 + lVar9 * 8) = auVar11;
    *(undefined1 (*) [32])(auStack_e0 + lVar9 * 8) = auVar25;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 == 0x10);
  dct2_butterfly_h16_avx2(local_140,8,dst,8,0x14 - bit_depth,bit_depth);
  return;
}

Assistant:

void itrans_dct2_h8_w16_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[8 * 16]);
    dct2_butterfly_h8_avx2(src, 16, tmp, 16, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h16_avx2(tmp, 8, dst, 8, 20 - bit_depth, bit_depth);
}